

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_ags.cpp
# Opt level: O0

bool dxil_spv::emit_wmma_return_values(Impl *impl,Id type_id,Id id,uint32_t phase)

{
  mapped_type mVar1;
  bool bVar2;
  mapped_type *pmVar3;
  CallInst *local_48;
  Id local_40;
  uint32_t uStack_3c;
  CallInst *local_38;
  CallInst *inst;
  uint local_28;
  uint32_t inst_index;
  uint32_t i;
  uint32_t phase_local;
  Id id_local;
  Id type_id_local;
  Impl *impl_local;
  
  inst_index = phase;
  i = id;
  phase_local = type_id;
  _id_local = impl;
  bVar2 = validate_wmma_io_registers
                    (impl,(impl->ags).num_instructions - 8,
                     AmdExtD3DShaderIntrinsicsWaveMatrixRegType_RetVal_Reg,phase,false);
  if (bVar2) {
    for (local_28 = 0; local_28 < 8; local_28 = local_28 + 1) {
      inst._4_4_ = ((_id_local->ags).num_instructions - 8) + local_28;
      local_38 = (_id_local->ags).backdoor_instructions[inst._4_4_];
      if (i != 0) {
        Converter::Impl::rewrite_value(_id_local,(Value *)local_38,i);
      }
      local_40 = phase_local;
      uStack_3c = local_28;
      local_48 = local_38;
      pmVar3 = std::
               unordered_map<const_LLVMBC::Value_*,_dxil_spv::Converter::Impl::AGSCoopMatMapping,_std::hash<const_LLVMBC::Value_*>,_std::equal_to<const_LLVMBC::Value_*>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::AGSCoopMatMapping>_>_>
               ::operator[](&(_id_local->ags).coopmat_component_mapping,(key_type *)&local_48);
      mVar1.component = uStack_3c;
      mVar1.type_id = local_40;
      *pmVar3 = mVar1;
    }
    impl_local._7_1_ = true;
  }
  else {
    impl_local._7_1_ = false;
  }
  return impl_local._7_1_;
}

Assistant:

static bool emit_wmma_return_values(Converter::Impl &impl, spv::Id type_id, spv::Id id, uint32_t phase)
{
	if (!validate_wmma_io_registers(impl, impl.ags.num_instructions - 8,
	                                AmdExtD3DShaderIntrinsicsWaveMatrixRegType_RetVal_Reg,
	                                phase, false))
	{
		return false;
	}

	// Validate output register assignment.
	for (uint32_t i = 0; i < 8; i++)
	{
		uint32_t inst_index = impl.ags.num_instructions - 8 + i;
		auto *inst = impl.ags.backdoor_instructions[inst_index];
		if (id)
			impl.rewrite_value(inst, id);
		impl.ags.coopmat_component_mapping[inst] = { type_id, i };
	}

	return true;
}